

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void __thiscall
duckdb::BinaryAggregateHeap<float,_int,_duckdb::GreaterThan>::Insert
          (BinaryAggregateHeap<float,_int,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          float *key,int *value)

{
  STORAGE_TYPE *pSVar1;
  idx_t iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  STORAGE_TYPE local_58;
  ulong local_50;
  STORAGE_TYPE local_48;
  float *local_40;
  int *local_38;
  
  pSVar1 = this->heap;
  uVar6 = this->size;
  if (uVar6 < this->capacity) {
    pSVar1[uVar6].first.value = *key;
    pSVar1[uVar6].second.value = *value;
    this->size = uVar6 + 1;
    local_58 = pSVar1[uVar6];
    if (1 < (long)(uVar6 + 1)) {
      do {
        uVar8 = (long)((uVar6 - ((long)(uVar6 - 1) >> 0x3f)) + -1) >> 1;
        bVar3 = GreaterThan::Operation<float>((float *)(pSVar1 + uVar8),(float *)&local_58);
        if (!bVar3) break;
        pSVar1[uVar6] = pSVar1[uVar8];
        bVar3 = 2 < (long)uVar6;
        uVar6 = uVar8;
      } while (bVar3);
    }
    pSVar1[uVar6] = local_58;
  }
  else {
    bVar3 = GreaterThan::Operation<float>(key,(float *)pSVar1);
    if (bVar3) {
      iVar2 = this->size;
      if (1 < (long)iVar2) {
        pSVar1 = this->heap;
        local_48 = pSVar1[iVar2 - 1];
        pSVar1[iVar2 - 1] = *pSVar1;
        local_50 = iVar2 * 8 - 8;
        lVar7 = (long)local_50 >> 3;
        local_40 = key;
        local_38 = value;
        if (lVar7 < 3) {
          lVar4 = 0;
        }
        else {
          lVar5 = 0;
          do {
            bVar3 = GreaterThan::Operation<float>
                              ((float *)(pSVar1 + lVar5 * 2 + 2),(float *)(pSVar1 + lVar5 * 2 + 1));
            if (bVar3) {
              lVar4 = lVar5 * 2 + 1;
            }
            else {
              lVar4 = lVar5 * 2 + 2;
            }
            pSVar1[lVar5] = pSVar1[lVar4];
            lVar5 = lVar4;
          } while (lVar4 < (lVar7 - (lVar7 + -1 >> 0x3f)) + -1 >> 1);
        }
        if (((local_50 & 8) == 0) && (lVar4 == lVar7 + -2 >> 1)) {
          pSVar1[lVar4] = pSVar1[lVar4 * 2 + 1];
          lVar4 = lVar4 * 2 + 1;
        }
        local_58 = local_48;
        if (0 < lVar4) {
          do {
            lVar7 = (lVar4 - (lVar4 + -1 >> 0x3f)) + -1 >> 1;
            bVar3 = GreaterThan::Operation<float>((float *)(pSVar1 + lVar7),(float *)&local_58);
            if (!bVar3) break;
            pSVar1[lVar4] = pSVar1[lVar7];
            bVar3 = 2 < lVar4;
            lVar4 = lVar7;
          } while (bVar3);
        }
        pSVar1[lVar4] = local_58;
        value = local_38;
        key = local_40;
      }
      pSVar1 = this->heap;
      iVar2 = this->size;
      pSVar1[iVar2 - 1].first.value = *key;
      pSVar1[iVar2 - 1].second.value = *value;
      local_58 = pSVar1[iVar2 - 1];
      lVar4 = (long)(iVar2 * 8) >> 3;
      lVar7 = lVar4 + -1;
      if (1 < lVar4) {
        do {
          lVar4 = (lVar7 - (lVar7 + -1 >> 0x3f)) + -1 >> 1;
          bVar3 = GreaterThan::Operation<float>((float *)(pSVar1 + lVar4),(float *)&local_58);
          if (!bVar3) break;
          pSVar1[lVar7] = pSVar1[lVar4];
          bVar3 = 2 < lVar7;
          lVar7 = lVar4;
        } while (bVar3);
      }
      pSVar1[lVar7] = local_58;
    }
  }
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}